

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int new_node(huffman_code *code)

{
  int iVar1;
  huffman_tree_node *phVar2;
  ulong uVar3;
  
  iVar1 = code->numentries;
  if (code->numallocatedentries == iVar1) {
    uVar3 = 0x100;
    if (0 < iVar1) {
      uVar3 = (ulong)(uint)(iVar1 * 2);
    }
    phVar2 = (huffman_tree_node *)realloc(code->tree,uVar3 * 8);
    if (phVar2 == (huffman_tree_node *)0x0) {
      return -1;
    }
    code->tree = phVar2;
    code->numallocatedentries = (int)uVar3;
  }
  phVar2 = code->tree;
  phVar2[code->numentries].branches[0] = -1;
  phVar2[code->numentries].branches[1] = -2;
  return 1;
}

Assistant:

static int
new_node(struct huffman_code *code)
{
  void *new_tree;
  if (code->numallocatedentries == code->numentries) {
    int new_num_entries = 256;
    if (code->numentries > 0) {
        new_num_entries = code->numentries * 2;
    }
    new_tree = realloc(code->tree, new_num_entries * sizeof(*code->tree));
    if (new_tree == NULL)
        return (-1);
    code->tree = (struct huffman_tree_node *)new_tree;
    code->numallocatedentries = new_num_entries;
  }
  code->tree[code->numentries].branches[0] = -1;
  code->tree[code->numentries].branches[1] = -2;
  return 1;
}